

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O0

int nn_binproc_create(void *hint,nn_epbase **epbase)

{
  nn_fsm *self_00;
  nn_ctx *ctx;
  nn_binproc *self;
  int rc;
  nn_epbase **epbase_local;
  void *hint_local;
  
  self_00 = (nn_fsm *)nn_alloc_(0x98);
  if (self_00 == (nn_fsm *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/binproc.c"
            ,0x3f);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_ins_item_init((nn_ins_item *)&self_00[1].shutdown_fn,&nn_binproc_vfptr,hint);
  ctx = nn_epbase_getctx((nn_epbase *)&self_00[1].shutdown_fn);
  nn_fsm_init_root(self_00,nn_binproc_handler,nn_binproc_shutdown,ctx);
  *(undefined4 *)&self_00[1].fn = 1;
  nn_list_init((nn_list *)&self_00[1].stopped);
  nn_fsm_start(self_00);
  hint_local._4_4_ = nn_ins_bind((nn_ins_item *)&self_00[1].shutdown_fn,nn_binproc_connect);
  if (hint_local._4_4_ < 0) {
    nn_list_term((nn_list *)&self_00[1].stopped);
    self_00->state = 1;
    nn_fsm_term(self_00);
    nn_ins_item_term((nn_ins_item *)&self_00[1].shutdown_fn);
    nn_free(self_00);
  }
  else {
    *epbase = (nn_epbase *)&self_00[1].shutdown_fn;
    hint_local._4_4_ = 0;
  }
  return hint_local._4_4_;
}

Assistant:

int nn_binproc_create (void *hint, struct nn_epbase **epbase)
{
    int rc;
    struct nn_binproc *self;

    self = nn_alloc (sizeof (struct nn_binproc), "binproc");
    alloc_assert (self);

    nn_ins_item_init (&self->item, &nn_binproc_vfptr, hint);
    nn_fsm_init_root (&self->fsm, nn_binproc_handler, nn_binproc_shutdown,
        nn_epbase_getctx (&self->item.epbase));
    self->state = NN_BINPROC_STATE_IDLE;
    nn_list_init (&self->sinprocs);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Register the inproc endpoint into a global repository. */
    rc = nn_ins_bind (&self->item, nn_binproc_connect);
    if (nn_slow (rc < 0)) {
        nn_list_term (&self->sinprocs);

        /*  TODO: Now, this is ugly! We are getting the state machine into
            the idle state manually. How should it be done correctly? */
        self->fsm.state = 1;
        nn_fsm_term (&self->fsm);

        nn_ins_item_term (&self->item);
        nn_free (self);
        return rc;
    }

    *epbase = &self->item.epbase;
    return 0;
}